

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O0

void Sfm_LibPrintObj(Sfm_Lib_t *p,Sfm_Fun_t *pObj)

{
  uint uVar1;
  int iVar2;
  Mio_Cell2_t *pCell2;
  Mio_Cell2_t *pCell;
  int *piVar3;
  int local_48;
  int *pProf;
  int Offset;
  int nFanins;
  int i;
  Mio_Cell2_t *pCellT;
  Mio_Cell2_t *pCellB;
  Sfm_Fun_t *pObj_local;
  Sfm_Lib_t *p_local;
  
  pCell2 = p->pCells + (int)pObj->pFansB[0];
  pCell = p->pCells + (int)pObj->pFansT[0];
  if (pCell == p->pCells) {
    local_48 = 0;
  }
  else {
    local_48 = (*(uint *)&pCell->field_0x10 >> 0x1c) - 1;
  }
  uVar1 = (*(uint *)&pCell2->field_0x10 >> 0x1c) + local_48;
  printf("F = %d  A =%6.2f  ",(double)pObj->Area * 0.001,(ulong)uVar1);
  if (pCell == p->pCells) {
    Sfm_LibPrintGate(pCell2,pObj->pFansB + 1,(Mio_Cell2_t *)0x0,(char *)0x0);
  }
  else {
    Sfm_LibPrintGate(pCell,pObj->pFansT + 1,pCell2,pObj->pFansB + 1);
  }
  if (p->fDelay != 0) {
    iVar2 = Sfm_LibFunId(p,pObj);
    iVar2 = Vec_IntEntry(&p->vProfs,iVar2);
    piVar3 = Vec_IntEntryP(&p->vStore,iVar2);
    for (Offset = 0; Offset < (int)uVar1; Offset = Offset + 1) {
      printf("%6.2f ",(double)piVar3[Offset] * 0.001);
    }
  }
  return;
}

Assistant:

void Sfm_LibPrintObj( Sfm_Lib_t * p, Sfm_Fun_t * pObj )
{
    Mio_Cell2_t * pCellB = p->pCells + (int)pObj->pFansB[0];
    Mio_Cell2_t * pCellT = p->pCells + (int)pObj->pFansT[0];
    int i, nFanins = pCellB->nFanins + (pCellT == p->pCells ? 0 : pCellT->nFanins - 1);
    printf( "F = %d  A =%6.2f  ", nFanins, MIO_NUMINV*pObj->Area );
    if ( pCellT == p->pCells )
        Sfm_LibPrintGate( pCellB, pObj->pFansB + 1, NULL, NULL );
    else
        Sfm_LibPrintGate( pCellT, pObj->pFansT + 1, pCellB, pObj->pFansB + 1 );
    // get hold of delay info
    if ( p->fDelay )
    {
        int Offset  = Vec_IntEntry( &p->vProfs, Sfm_LibFunId(p, pObj) );
        int * pProf = Vec_IntEntryP( &p->vStore, Offset );
        for ( i = 0; i < nFanins; i++ )
            printf( "%6.2f ", MIO_NUMINV*pProf[i] );
    }
}